

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall
choc::value::Type::AllocatedVector<choc::value::MemberNameAndType>::reserve
          (AllocatedVector<choc::value::MemberNameAndType> *this,uint32_t needed)

{
  MemberNameAndType *pMVar1;
  uint uVar2;
  size_t size;
  void *newItems;
  MemberNameAndType *reallocated;
  unsigned_long bytesNeeded;
  uint32_t needed_local;
  AllocatedVector<choc::value::MemberNameAndType> *this_local;
  
  if (this->capacity < needed) {
    uVar2 = needed + 7 & 0xfffffff8;
    size = (ulong)uVar2 * 0x30;
    pMVar1 = (MemberNameAndType *)
             anon_unknown_15::resizeAllocationIfPossible(this->allocator,this->items,size);
    if (pMVar1 == (MemberNameAndType *)0x0) {
      pMVar1 = (MemberNameAndType *)anon_unknown_15::allocateBytes(this->allocator,size);
      if (this->size != 0) {
        memcpy(pMVar1,this->items,(ulong)this->size * 0x30);
      }
      anon_unknown_15::freeBytes(this->allocator,this->items);
      this->items = pMVar1;
    }
    else {
      this->items = pMVar1;
    }
    this->capacity = uVar2;
  }
  return;
}

Assistant:

void reserve (uint32_t needed)
    {
        if (capacity < needed)
        {
            needed = (needed + 7u) & ~7u;
            auto bytesNeeded = sizeof (ObjectType) * needed;

            if (auto reallocated = static_cast<ObjectType*> (resizeAllocationIfPossible (allocator, items, bytesNeeded)))
            {
                items = reallocated;
            }
            else
            {
                auto newItems = allocateBytes (allocator, bytesNeeded);

                if (size != 0)
                    std::memcpy (newItems, items, size * sizeof (ObjectType));

                freeBytes (allocator, items);
                items = static_cast<ObjectType*> (newItems);
            }

            capacity = needed;
        }
    }